

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceAreas
          (IntrinsicGeometryInterface *this)

{
  Edge e;
  Edge e_00;
  Edge e_01;
  Face e_02;
  bool bVar1;
  double *pdVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ParentMeshT *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  double area;
  double arg;
  double s;
  double c;
  double b;
  double a;
  Halfedge he;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  MeshData<geometrycentral::surface::Face,_double> *in_stack_fffffffffffffd68;
  SurfaceMesh *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  MeshData<geometrycentral::surface::Face,_double> *this_00;
  ParentMeshT *in_stack_fffffffffffffd88;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *in_stack_fffffffffffffd90;
  ParentMeshT *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  double in_stack_fffffffffffffdb8;
  int __val;
  undefined1 local_1f9 [161];
  string local_158 [32];
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_138;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_128;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_118;
  double local_108;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_100;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_f0;
  double local_e0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_d8;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_c8;
  double local_b8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_b0;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_a0;
  undefined1 local_60 [24];
  undefined1 *local_48;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffd70);
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)in_stack_fffffffffffffda0,in_RDI);
  MeshData<geometrycentral::surface::Face,_double>::operator=
            ((MeshData<geometrycentral::surface::Face,_double> *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68);
  MeshData<geometrycentral::surface::Face,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)in_stack_fffffffffffffd70);
  SurfaceMesh::faces(in_stack_fffffffffffffd70);
  local_48 = local_60;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd70);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd70);
  while( true ) {
    __val = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffd70,
                       (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffd68);
    if (!bVar1) {
      return;
    }
    local_a0 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x2422ef);
    local_b0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Face::halfedge((Face *)in_stack_fffffffffffffd70);
    this_00 = (MeshData<geometrycentral::surface::Face,_double> *)
              &in_RDI[1].vertexPermuteCallbackList;
    local_c8 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::edge((Halfedge *)in_stack_fffffffffffffd70);
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffd90;
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffd88;
    pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_double> *)this_00,e);
    local_b8 = *pdVar2;
    local_d8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::next((Halfedge *)in_stack_fffffffffffffd70);
    local_b0.mesh = local_d8.mesh;
    local_b0.ind = local_d8.ind;
    in_stack_fffffffffffffd88 = (ParentMeshT *)&in_RDI[1].vertexPermuteCallbackList;
    local_f0 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::edge((Halfedge *)in_stack_fffffffffffffd70);
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffd90;
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffd88;
    pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_double> *)this_00,e_00);
    local_e0 = *pdVar2;
    local_100 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::next((Halfedge *)in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd90 = &in_RDI[1].vertexPermuteCallbackList;
    local_b0 = local_100;
    local_118 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::edge((Halfedge *)in_stack_fffffffffffffd70);
    e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffd90;
    e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffd88;
    pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_double> *)this_00,e_01);
    local_108 = *pdVar2;
    local_128 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::next((Halfedge *)in_stack_fffffffffffffd70);
    local_138 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Face::halfedge((Face *)in_stack_fffffffffffffd70);
    bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator==(&local_128,&local_138);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    dVar3 = (local_b8 + local_e0 + local_108) / 2.0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar3 * (dVar3 - local_b8) * (dVar3 - local_e0) * (dVar3 - local_108);
    auVar4 = vmaxsd_avx(auVar4,(undefined1  [16])0x0);
    in_stack_fffffffffffffdb8 = auVar4._0_8_;
    in_stack_fffffffffffffd68 =
         (MeshData<geometrycentral::surface::Face,_double> *)sqrt(in_stack_fffffffffffffdb8);
    e_02.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffd90;
    e_02.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffd88;
    in_stack_fffffffffffffda0 = local_a0.mesh;
    in_stack_fffffffffffffda8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0.ind;
    pdVar2 = MeshData<geometrycentral::surface::Face,_double>::operator[](this_00,e_02);
    *pdVar2 = (double)in_stack_fffffffffffffd68;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd70)
    ;
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_1f9 + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
             ,(allocator *)__lhs);
  ::std::operator+((char *)__lhs,__rhs);
  ::std::operator+(__lhs,(char *)__rhs);
  ::std::__cxx11::to_string(__val);
  ::std::operator+(in_stack_fffffffffffffda8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffda0);
  ::std::operator+(__lhs,(char *)__rhs);
  ::std::operator+(__lhs,(char *)__rhs);
  ::std::runtime_error::runtime_error((runtime_error *)__rhs,local_158);
  __cxa_throw(__rhs,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IntrinsicGeometryInterface::computeFaceAreas() {
  edgeLengthsQ.ensureHave();

  // ONEDAY try these for better accuracy in near-degenerate triangles?
  // "Miscalculating Area and Angles of a Needle-like Triangle" https://www.cs.unc.edu/~snoeyink/c/c205/Triangle.pdf

  faceAreas = FaceData<double>(mesh);
  for (Face f : mesh.faces()) {
    // WARNING: Logic duplicated between cached and immediate version

    Halfedge he = f.halfedge();
    double a = edgeLengths[he.edge()];
    he = he.next();
    double b = edgeLengths[he.edge()];
    he = he.next();
    double c = edgeLengths[he.edge()];

    GC_SAFETY_ASSERT(he.next() == f.halfedge(), "faces must be triangular");

    // Herons formula
    double s = (a + b + c) / 2.0;
    double arg = s * (s - a) * (s - b) * (s - c);
    arg = std::fmax(0., arg);
    double area = std::sqrt(arg);

    faceAreas[f] = area;
  }
}